

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::removeSafeState(RBBITableBuilder *this,IntPair duplStates)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  char16_t cVar4;
  UChar c;
  uint uVar5;
  UnicodeString *this_00;
  char16_t *pcVar6;
  ulong uVar7;
  int index;
  uint index_00;
  
  index_00 = duplStates.second;
  UVector::removeElementAt(this->fSafeTable,index_00);
  iVar2 = this->fSafeTable->count;
  if (0 < iVar2) {
    index = 0;
    do {
      this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index);
      sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar5 = (this_00->fUnion).fFields.fLength;
      }
      else {
        uVar5 = (int)sVar1 >> 5;
      }
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
          uVar3 = (int)sVar1 >> 5;
          if (sVar1 < 0) {
            uVar3 = (this_00->fUnion).fFields.fLength;
          }
          cVar4 = L'\xffff';
          if (uVar7 < uVar3) {
            pcVar6 = (char16_t *)((long)&this_00->fUnion + 2);
            if (((int)sVar1 & 2U) == 0) {
              pcVar6 = (this_00->fUnion).fFields.fArray;
            }
            cVar4 = pcVar6[uVar7];
          }
          c = cVar4 - (ushort)((int)index_00 < (int)(uint)(ushort)cVar4);
          if ((ushort)cVar4 == index_00) {
            c = (UChar)duplStates.first;
          }
          UnicodeString::setCharAt(this_00,(int32_t)uVar7,c);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      index = index + 1;
    } while (index != iVar2);
  }
  return;
}

Assistant:

void RBBITableBuilder::removeSafeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fSafeTable->size());

    fSafeTable->removeElementAt(duplState);   // Note that fSafeTable has a deleter function
                                              // and will auto-delete the removed element.
    int32_t numStates = fSafeTable->size();
    for (int32_t state=0; state<numStates; ++state) {
        UnicodeString *sd = (UnicodeString *)fSafeTable->elementAt(state);
        int32_t numCols = sd->length();
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->charAt(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->setCharAt(col, static_cast<char16_t>(newVal));
        }
    }
}